

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::check_op(Parser *this)

{
  reference pvVar1;
  Exception *pEVar2;
  mapped_type *pmVar3;
  Lex local_44;
  Lex local_38 [2];
  lex_t local_20;
  lex_t local_1c;
  lex_t result_type;
  lex_t operation;
  lex_t operand2;
  lex_t operand1;
  Parser *this_local;
  
  _operand2 = this;
  pvVar1 = std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::top(&this->lex_stack);
  result_type = Lex::get_type(pvVar1);
  std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::pop(&this->lex_stack);
  pvVar1 = std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::top(&this->lex_stack);
  local_1c = Lex::get_type(pvVar1);
  std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::pop(&this->lex_stack);
  pvVar1 = std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::top(&this->lex_stack);
  operation = Lex::get_type(pvVar1);
  std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::pop(&this->lex_stack);
  if (operation == LEX_INT) {
    if ((((local_1c == LEX_PLUS) || (local_1c == LEX_MINUS)) || (local_1c == LEX_TIMES)) ||
       ((local_1c == LEX_SLASH || (local_1c == LEX_ASSIGN)))) {
      local_20 = LEX_INT;
    }
    else {
      if (((local_1c != LEX_EQ) && (local_1c != LEX_LSS)) &&
         ((local_1c != LEX_GTR &&
          (((local_1c != LEX_LEQ && (local_1c != LEX_GEQ)) && (local_1c != LEX_NEQ)))))) {
        pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar3 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
        Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
        __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
      }
      local_20 = LEX_BOOL;
    }
    if (result_type != LEX_INT) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar3 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
      Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else if (operation == LEX_BOOL) {
    if ((local_1c != LEX_OR) && (local_1c != LEX_AND)) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar3 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
      Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_20 = LEX_BOOL;
    if (result_type != LEX_BOOL) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar3 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
      Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    if ((operation != LEX_STRING) && (operation != LEX_STRC)) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar3 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
      Exception::Exception(pEVar2,"Parser error: wrong operation: ",pmVar3);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
    if (local_1c == LEX_PLUS) {
      local_20 = LEX_STRING;
    }
    else {
      if ((((local_1c != LEX_EQ) && (local_1c != LEX_LSS)) && (local_1c != LEX_GTR)) &&
         (((local_1c != LEX_LEQ && (local_1c != LEX_GEQ)) && (local_1c != LEX_NEQ)))) {
        pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar3 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
        Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
        __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
      }
      local_20 = LEX_BOOL;
    }
    if ((result_type != LEX_STRING) && (result_type != LEX_STRC)) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar3 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_1c);
      Exception::Exception(pEVar2,"Parser error: wrong type in operation: ",pmVar3);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  Lex::Lex(local_38,local_20,0,0);
  std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::push(&this->lex_stack,local_38);
  Lex::~Lex(local_38);
  Lex::Lex(&local_44,local_1c,0,0);
  std::vector<Lex,_std::allocator<Lex>_>::push_back
            (&(this->prog).super_vector<Lex,_std::allocator<Lex>_>,&local_44);
  Lex::~Lex(&local_44);
  return;
}

Assistant:

void Parser::check_op() {
    lex_t operand1, operand2, operation, result_type;
    operand2 = lex_stack.top().get_type();
    lex_stack.pop();
    operation = lex_stack.top().get_type();
    lex_stack.pop();
    operand1 = lex_stack.top().get_type();
    lex_stack.pop();

    if(operand1 == LEX_INT){
        if(operation == LEX_PLUS || operation == LEX_MINUS ||
                operation == LEX_TIMES || operation == LEX_SLASH || operation == LEX_ASSIGN){
            result_type = LEX_INT;
        } else if ( operation == LEX_EQ || operation == LEX_LSS || operation == LEX_GTR ||
                    operation == LEX_LEQ || operation == LEX_GEQ || operation == LEX_NEQ ){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand1 != operand2)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else if(operand1 == LEX_BOOL){
        if(operation == LEX_OR || operation == LEX_AND){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand1 != operand2)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else if(operand1 == LEX_STRING || operand1 == LEX_STRC){
        if(operation == LEX_PLUS){
            result_type = LEX_STRING;
        } else if(operation == LEX_EQ || operation == LEX_LSS || operation == LEX_GTR ||
                  operation == LEX_LEQ || operation == LEX_GEQ || operation == LEX_NEQ){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand2 != LEX_STRING && operand2 != LEX_STRC)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else throw Exception("Parser error: wrong operation: ", Lex::lex_map[operation]);
    lex_stack.push(result_type);
    prog.push_back(operation);

}